

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O3

bool deqp::gls::BufferTestUtil::compareByteArrays
               (TestLog *log,deUint8 *resPtr,deUint8 *refPtr,int numBytes)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ostringstream *poVar12;
  string local_220;
  string local_200;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  long local_1c8;
  deUint8 *local_1c0;
  deUint8 *local_1b8;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Verify","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Verification result","");
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_200,&local_220);
  tcu::TestLog::startSection(log,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (numBytes < 1) {
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    bVar4 = true;
  }
  else {
    local_1e0 = (ulong)(uint)numBytes;
    uVar6 = 0xffffffff;
    bVar4 = true;
    uVar8 = 0;
    uVar2 = 0;
    do {
      local_1c8 = local_1e0 - uVar2;
      local_1b8 = resPtr + uVar2;
      local_1c0 = refPtr + uVar2;
      uVar9 = (ulong)uVar8;
      lVar10 = 0;
      local_1d8 = uVar9;
      local_1d0 = uVar2;
      while( true ) {
        poVar12 = (ostringstream *)(local_1b0 + 8);
        iVar5 = (int)lVar10;
        iVar1 = (int)uVar9 + iVar5;
        iVar11 = (int)uVar6;
        if (local_1b8[lVar10] != local_1c0[lVar10]) break;
        if (iVar11 < 0) goto LAB_00969bfc;
        if (iVar1 < 4) {
          iVar1 = ((int)uVar2 + iVar5) - iVar11;
          iVar5 = 8;
          if (iVar1 < 8) {
            iVar5 = iVar1;
          }
          poVar12 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar12);
          std::ostream::operator<<(poVar12,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar12," byte difference at offset ",0x1b);
          std::ostream::operator<<(poVar12,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"  expected ",0xb);
          local_200._M_dataplus._M_p = (pointer)(refPtr + uVar6);
          local_200._M_string_length = (size_type)(local_200._M_dataplus._M_p + iVar5);
          tcu::Format::operator<<
                    ((ostream *)poVar12,
                     (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                     &local_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"  got ",6);
          local_220._M_dataplus._M_p = (pointer)(resPtr + uVar6);
          local_220._M_string_length = (size_type)(local_220._M_dataplus._M_p + iVar5);
          tcu::Format::operator<<
                    ((ostream *)poVar12,
                     (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                     &local_220);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar12);
          std::ios_base::~ios_base(local_138);
          uVar2 = local_1d0;
          uVar9 = local_1d8;
        }
        else {
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar12,"(output too long, truncated)",0x1c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar12);
          std::ios_base::~ios_base(local_138);
        }
        lVar10 = lVar10 + 1;
        uVar6 = 0xffffffff;
        if (local_1c8 == lVar10) goto LAB_00969d74;
      }
      if (iVar11 < 0) {
        uVar6 = (ulong)(uint)((int)uVar2 + iVar5);
      }
      bVar4 = false;
LAB_00969bfc:
      uVar3 = ~uVar2;
      uVar8 = (int)uVar9 + iVar5;
      uVar2 = uVar2 + lVar10 + 1;
    } while (uVar3 + local_1e0 != lVar10);
    iVar5 = (int)uVar6;
    if (iVar5 < 0) {
LAB_00969d74:
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    }
    else {
      if (3 < iVar1) {
        poVar12 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar12,"(output too long, truncated)",0x1c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar12);
        std::ios_base::~ios_base(local_138);
        goto LAB_00969d74;
      }
      iVar11 = numBytes - iVar5;
      iVar1 = 8;
      if (iVar11 < 8) {
        iVar1 = iVar11;
      }
      poVar12 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar12);
      std::ostream::operator<<(poVar12,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar12," byte difference at offset ",0x1b);
      std::ostream::operator<<(poVar12,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"  expected ",0xb);
      local_200._M_dataplus._M_p = (pointer)(refPtr + uVar6);
      local_200._M_string_length = (size_type)(local_200._M_dataplus._M_p + iVar1);
      tcu::Format::operator<<
                ((ostream *)poVar12,
                 (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                 &local_200);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"  got ",6);
      local_220._M_dataplus._M_p = (pointer)(resPtr + uVar6);
      local_220._M_string_length = (size_type)(local_220._M_dataplus._M_p + iVar1);
      tcu::Format::operator<<
                ((ostream *)poVar12,
                 (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                 &local_220);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar12);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar12);
    }
    if (!bVar4) {
      pcVar7 = "Verification FAILED!";
      goto LAB_00969db1;
    }
  }
  pcVar7 = "Verification passed.";
LAB_00969db1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),pcVar7,0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::TestLog::endSection(log);
  return bVar4;
}

Assistant:

bool compareByteArrays (tcu::TestLog& log, const deUint8* resPtr, const deUint8* refPtr, int numBytes)
{
	bool			isOk			= true;
	const int		maxSpanLen		= 8;
	const int		maxDiffSpans	= 4;
	int				numDiffSpans	= 0;
	int				diffSpanStart	= -1;
	int				ndx				= 0;

	log << TestLog::Section("Verify", "Verification result");

	for (;ndx < numBytes; ndx++)
	{
		if (resPtr[ndx] != refPtr[ndx])
		{
			if (diffSpanStart < 0)
				diffSpanStart = ndx;

			isOk = false;
		}
		else if (diffSpanStart >= 0)
		{
			if (numDiffSpans < maxDiffSpans)
			{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;

			numDiffSpans	+= 1;
			diffSpanStart	 = -1;
		}
	}

	if (diffSpanStart >= 0)
	{
		if (numDiffSpans < maxDiffSpans)
		{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
		}
		else
			log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;
	}

	log << TestLog::Message << (isOk ? "Verification passed." : "Verification FAILED!") << TestLog::EndMessage;
	log << TestLog::EndSection;

	return isOk;
}